

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall FArchive::WriteName(FArchive *this,char *name)

{
  DWORD count;
  undefined1 local_19;
  DWORD index;
  BYTE id;
  char *name_local;
  FArchive *this_local;
  
  _index = name;
  name_local = (char *)this;
  if (name == (char *)0x0) {
    local_19 = 0x21;
    (*this->_vptr_FArchive[2])(this,&local_19,1);
  }
  else {
    count = FindName(this,name);
    if (count == 0xffffffff) {
      AddName(this,_index);
      local_19 = 0x1b;
      (*this->_vptr_FArchive[2])(this,&local_19,1);
      WriteString(this,_index);
    }
    else {
      local_19 = 0x1c;
      (*this->_vptr_FArchive[2])(this,&local_19,1);
      WriteCount(this,count);
    }
  }
  return;
}

Assistant:

void FArchive::WriteName (const char *name)
{
	BYTE id;

	if (name == NULL)
	{
		id = NIL_NAME;
		Write (&id, 1);
	}
	else
	{
		DWORD index = FindName (name);
		if (index != NameMap::NO_INDEX)
		{
			id = OLD_NAME;
			Write (&id, 1);
			WriteCount (index);
		}
		else
		{
			AddName (name);
			id = NEW_NAME;
			Write (&id, 1);
			WriteString (name);
		}
	}
}